

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O2

int zueci_u_utf16le(zueci_u32 u,uchar *dest)

{
  int iVar1;
  byte bVar2;
  zueci_u32 zVar3;
  byte bVar4;
  
  bVar4 = (byte)(u >> 8);
  if (u < 0x10000) {
    iVar1 = 2;
    zVar3 = u;
    bVar2 = bVar4;
  }
  else {
    zVar3 = u - 0x10000 >> 10;
    bVar2 = (char)(u - 0x10000 >> 0x12) - 0x28;
    dest[2] = (uchar)u;
    dest[3] = bVar4 & 3 | 0xdc;
    iVar1 = 4;
  }
  *dest = (uchar)zVar3;
  dest[1] = bVar2;
  return iVar1;
}

Assistant:

static int zueci_u_utf16le(const zueci_u32 u, unsigned char *dest) {
    zueci_u32 u2, v;
    if (u < 0x10000) {
        dest[0] = (unsigned char) u;
        dest[1] = (unsigned char) (u >> 8);
        return 2;
    }
    u2 = u - 0x10000;
    v = u2 >> 10;
    dest[0] = (unsigned char) v;
    dest[1] = (unsigned char) (0xD8 + (v >> 8));
    v = u2 & 0x3FF;
    dest[2] = (unsigned char) v;
    dest[3] = (unsigned char) (0xDC + (v >> 8));
    return 4;
}